

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O3

bool __thiscall jrtplib::RTPFakeTransmitter::SupportsMulticasting(RTPFakeTransmitter *this)

{
  if (this->init == true) {
    return (bool)(this->supportsmulticasting & this->created);
  }
  return false;
}

Assistant:

bool RTPFakeTransmitter::SupportsMulticasting()
{
	if (!init)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (!created)
		v = false;
	else
		v = supportsmulticasting;

	MAINMUTEX_UNLOCK
	return v;
}